

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O0

string_view absl::StripLeadingAsciiWhitespace(string_view str)

{
  char *__pos;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view sVar2;
  char *it;
  basic_string_view<char,_std::char_traits<char>_> *this;
  char *in_stack_ffffffffffffffd8;
  
  this = (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe0;
  std::basic_string_view<char,_std::char_traits<char>_>::begin(this);
  std::basic_string_view<char,_std::char_traits<char>_>::end(this);
  __pos = std::find_if_not<char_const*,bool(*)(unsigned_char)>
                    ((char *)in_RDI,in_stack_ffffffffffffffd8,(_func_bool_uchar *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::begin(this);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (in_RDI,(size_type)__pos,(size_type)this);
  sVar2._M_len = bVar1._M_len;
  sVar2._M_str = bVar1._M_str;
  return sVar2;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripLeadingAsciiWhitespace(
    absl::string_view str) {
  auto it = std::find_if_not(str.begin(), str.end(), absl::ascii_isspace);
  return str.substr(static_cast<size_t>(it - str.begin()));
}